

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QTimeZonePrivate::Data>::emplace<QTimeZonePrivate::Data>
          (QMovableArrayOps<QTimeZonePrivate::Data> *this,qsizetype i,Data *args)

{
  Data **ppDVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  qint64 *pqVar4;
  int iVar5;
  long lVar6;
  Data *pDVar7;
  Data *pDVar8;
  Data *pDVar9;
  char16_t *pcVar10;
  qsizetype qVar11;
  undefined4 uVar12;
  int iVar13;
  qint64 qVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  long in_FS_OFFSET;
  bool bVar17;
  undefined4 local_58;
  undefined4 uStack_54;
  int iStack_50;
  int iStack_4c;
  
  lVar6 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar7 = (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
           super_QArrayDataPointer<QTimeZonePrivate::Data>.d;
  if ((pDVar7 == (Data *)0x0) ||
     (1 < (__int_type_conflict)(pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_00402a25:
    pDVar9 = (args->abbreviation).d.d;
    pcVar10 = (args->abbreviation).d.ptr;
    (args->abbreviation).d.d = (Data *)0x0;
    (args->abbreviation).d.ptr = (char16_t *)0x0;
    qVar11 = (args->abbreviation).d.size;
    (args->abbreviation).d.size = 0;
    iVar5 = args->daylightTimeOffset;
    qVar14 = args->atMSecsSinceEpoch;
    uVar15 = args->offsetFromUtc;
    uVar16 = args->standardTimeOffset;
    bVar17 = (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
             super_QArrayDataPointer<QTimeZonePrivate::Data>.size != 0;
    QArrayDataPointer<QTimeZonePrivate::Data>::detachAndGrow
              ((QArrayDataPointer<QTimeZonePrivate::Data> *)this,(uint)(i == 0 && bVar17),1,
               (Data **)0x0,(QArrayDataPointer<QTimeZonePrivate::Data> *)0x0);
    pDVar8 = (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
             super_QArrayDataPointer<QTimeZonePrivate::Data>.ptr;
    local_58 = (undefined4)qVar14;
    uStack_54 = (undefined4)((ulong)qVar14 >> 0x20);
    if (i != 0 || !bVar17) {
      pDVar3 = pDVar8 + i;
      memmove(pDVar3 + 1,pDVar8 + i,
              ((this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
               super_QArrayDataPointer<QTimeZonePrivate::Data>.size - i) * 0x30);
      (pDVar3->abbreviation).d.d = pDVar9;
      (pDVar3->abbreviation).d.ptr = pcVar10;
      (pDVar3->abbreviation).d.size = qVar11;
      *(undefined4 *)&pDVar3->atMSecsSinceEpoch = local_58;
      *(undefined4 *)((long)&pDVar3->atMSecsSinceEpoch + 4) = uStack_54;
      pDVar3->offsetFromUtc = uVar15;
      pDVar3->standardTimeOffset = uVar16;
      pDVar3->daylightTimeOffset = iVar5;
      goto LAB_00402aed;
    }
    pDVar8[-1].abbreviation.d.d = pDVar9;
    pDVar8[-1].abbreviation.d.ptr = pcVar10;
    pDVar8[-1].abbreviation.d.size = qVar11;
    *(undefined4 *)&pDVar8[-1].atMSecsSinceEpoch = local_58;
    *(undefined4 *)((long)&pDVar8[-1].atMSecsSinceEpoch + 4) = uStack_54;
    pDVar8[-1].offsetFromUtc = uVar15;
    pDVar8[-1].standardTimeOffset = uVar16;
    pDVar8[-1].daylightTimeOffset = iVar5;
  }
  else {
    if (((this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
         super_QArrayDataPointer<QTimeZonePrivate::Data>.size == i) &&
       (pDVar8 = (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
                 super_QArrayDataPointer<QTimeZonePrivate::Data>.ptr,
       (pDVar7->super_QArrayData).alloc - i !=
       ((long)((long)pDVar8 -
              ((ulong)((long)&pDVar7[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
       -0x5555555555555555)) {
      pDVar9 = (args->abbreviation).d.d;
      (args->abbreviation).d.d = (Data *)0x0;
      pDVar8[i].abbreviation.d.d = pDVar9;
      pcVar10 = (args->abbreviation).d.ptr;
      (args->abbreviation).d.ptr = (char16_t *)0x0;
      pDVar8[i].abbreviation.d.ptr = pcVar10;
      qVar11 = (args->abbreviation).d.size;
      (args->abbreviation).d.size = 0;
      pDVar8[i].abbreviation.d.size = qVar11;
      uVar12 = *(undefined4 *)((long)&args->atMSecsSinceEpoch + 4);
      iVar5 = args->offsetFromUtc;
      iVar13 = args->standardTimeOffset;
      pqVar4 = &pDVar8[i].atMSecsSinceEpoch;
      *(int *)pqVar4 = (int)args->atMSecsSinceEpoch;
      *(undefined4 *)((long)pqVar4 + 4) = uVar12;
      *(int *)(pqVar4 + 1) = iVar5;
      *(int *)((long)pqVar4 + 0xc) = iVar13;
      pDVar8[i].daylightTimeOffset = args->daylightTimeOffset;
      goto LAB_00402aed;
    }
    if ((i != 0) ||
       (pDVar8 = (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
                 super_QArrayDataPointer<QTimeZonePrivate::Data>.ptr,
       (Data *)((ulong)((long)&pDVar7[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
       pDVar8)) goto LAB_00402a25;
    pDVar9 = (args->abbreviation).d.d;
    (args->abbreviation).d.d = (Data *)0x0;
    pDVar8[-1].abbreviation.d.d = pDVar9;
    pcVar10 = (args->abbreviation).d.ptr;
    (args->abbreviation).d.ptr = (char16_t *)0x0;
    pDVar8[-1].abbreviation.d.ptr = pcVar10;
    qVar11 = (args->abbreviation).d.size;
    (args->abbreviation).d.size = 0;
    pDVar8[-1].abbreviation.d.size = qVar11;
    uVar12 = *(undefined4 *)((long)&args->atMSecsSinceEpoch + 4);
    iVar5 = args->offsetFromUtc;
    iVar13 = args->standardTimeOffset;
    *(int *)&pDVar8[-1].atMSecsSinceEpoch = (int)args->atMSecsSinceEpoch;
    *(undefined4 *)((long)&pDVar8[-1].atMSecsSinceEpoch + 4) = uVar12;
    pDVar8[-1].offsetFromUtc = iVar5;
    pDVar8[-1].standardTimeOffset = iVar13;
    pDVar8[-1].daylightTimeOffset = args->daylightTimeOffset;
  }
  ppDVar1 = &(this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
             super_QArrayDataPointer<QTimeZonePrivate::Data>.ptr;
  *ppDVar1 = *ppDVar1 + -1;
LAB_00402aed:
  pqVar2 = &(this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
            super_QArrayDataPointer<QTimeZonePrivate::Data>.size;
  *pqVar2 = *pqVar2 + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar6) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }